

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CoordTopocentric.h
# Opt level: O2

string * __thiscall
libsgp4::CoordTopocentric::ToString_abi_cxx11_
          (string *__return_storage_ptr__,CoordTopocentric *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream local_1a0 [16];
  long local_190;
  undefined8 local_188 [2];
  uint auStack_178 [88];
  
  std::__cxx11::stringstream::stringstream(local_1a0);
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xffffff4f | 0x80;
  *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) =
       *(uint *)((long)auStack_178 + *(long *)(local_190 + -0x18)) & 0xfffffefb | 4;
  *(undefined8 *)((long)local_188 + *(long *)(local_190 + -0x18)) = 3;
  poVar1 = std::operator<<((ostream *)&local_190,"Az: ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  std::ostream::_M_insert<double>((this->azimuth * 180.0) / 3.141592653589793);
  poVar1 = std::operator<<((ostream *)&local_190,", El: ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 8;
  std::ostream::_M_insert<double>((this->elevation * 180.0) / 3.141592653589793);
  poVar1 = std::operator<<((ostream *)&local_190,", Rng: ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 10;
  std::ostream::_M_insert<double>(this->range);
  poVar1 = std::operator<<((ostream *)&local_190,", Rng Rt: ");
  *(undefined8 *)(poVar1 + *(long *)(*(long *)poVar1 + -0x18) + 0x10) = 7;
  std::ostream::_M_insert<double>(this->range_rate);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

std::string ToString() const
    {
        std::stringstream ss;
        ss << std::right << std::fixed << std::setprecision(3);
        ss << "Az: " << std::setw(8) << Util::RadiansToDegrees(azimuth);
        ss << ", El: " << std::setw(8) << Util::RadiansToDegrees(elevation);
        ss << ", Rng: " << std::setw(10) << range;
        ss << ", Rng Rt: " << std::setw(7) << range_rate;
        return ss.str();
    }